

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav_preinit(ma_dr_wav *pWav,ma_dr_wav_read_proc onRead,ma_dr_wav_seek_proc onSeek,
                           void *pReadSeekUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_bool32 mVar4;
  
  mVar4 = 0;
  if (onSeek != (ma_dr_wav_seek_proc)0x0 &&
      (onRead != (ma_dr_wav_read_proc)0x0 && pWav != (ma_dr_wav *)0x0)) {
    memset(&pWav->onWrite,0,0x188);
    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pReadSeekUserData;
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      (pWav->allocationCallbacks).onMalloc = ma_dr_wav__malloc_default;
      (pWav->allocationCallbacks).onRealloc = ma_dr_wav__realloc_default;
      (pWav->allocationCallbacks).onFree = ma_dr_wav__free_default;
    }
    else {
      p_Var1 = pAllocationCallbacks->onMalloc;
      p_Var2 = pAllocationCallbacks->onRealloc;
      p_Var3 = pAllocationCallbacks->onFree;
      (pWav->allocationCallbacks).pUserData = pAllocationCallbacks->pUserData;
      (pWav->allocationCallbacks).onMalloc = p_Var1;
      (pWav->allocationCallbacks).onRealloc = p_Var2;
      (pWav->allocationCallbacks).onFree = p_Var3;
      if (p_Var3 == (_func_void_void_ptr_void_ptr *)0x0) {
        return 0;
      }
      if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
          p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        return 0;
      }
    }
    mVar4 = 1;
  }
  return mVar4;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit(ma_dr_wav* pWav, ma_dr_wav_read_proc onRead, ma_dr_wav_seek_proc onSeek, void* pReadSeekUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onRead == NULL || onSeek == NULL) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onRead    = onRead;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pReadSeekUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    return MA_TRUE;
}